

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskUtil.cpp
# Opt level: O2

void scale_flux(vector<unsigned_int,_std::allocator<unsigned_int>_> *flux_rev,uint64_t numerator,
               uint64_t denominator)

{
  uint *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1;
  uint *time;
  uint *puVar4;
  long lVar5;
  undefined8 uVar6;
  
  puVar1 = (flux_rev->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar5 = 0;
  uVar6 = 0;
  for (puVar4 = (flux_rev->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1) {
    lVar5 = lVar5 + (ulong)*puVar4;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = denominator;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = lVar5 * numerator;
    *puVar4 = SUB164(auVar3 / auVar2,0) - (int)uVar6;
    uVar6 = SUB168(auVar3 / auVar2,0);
  }
  return;
}

Assistant:

void scale_flux(std::vector<uint32_t>& flux_rev, uint64_t numerator, uint64_t denominator)
{
    uint64_t old_total = 0, new_total = 0;
    for (auto& time : flux_rev)
    {
        old_total += time;
        auto new_target = old_total * numerator / denominator;
        time = static_cast<uint32_t>(new_target - new_total);
        new_total += time;
    }
}